

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlReconciliateNs(xmlDocPtr doc,xmlNodePtr tree)

{
  int iVar1;
  xmlNsPtr pxVar2;
  _xmlNode *p_Var3;
  ulong uVar4;
  ulong uVar5;
  _xmlNode *p_Var6;
  int iVar7;
  uint uVar8;
  xmlNsPtr *ppxVar9;
  _xmlAttr *p_Var10;
  xmlNodePtr pxVar11;
  int sizeCache;
  xmlNsCache *cache;
  int local_3c;
  xmlNsCache *local_38;
  
  local_38 = (xmlNsCache *)0x0;
  local_3c = 0;
  iVar7 = -1;
  if (((tree != (xmlNodePtr)0x0) && (tree->type == XML_ELEMENT_NODE)) && (tree->doc == doc)) {
    iVar7 = 0;
    uVar8 = 0;
    p_Var6 = tree;
    do {
      if (p_Var6->ns != (xmlNs *)0x0) {
        if ((int)uVar8 < 1) {
          uVar5 = 0;
        }
        else {
          uVar5 = (ulong)uVar8;
          ppxVar9 = &local_38->newNs;
          uVar4 = 0;
          do {
            if (((xmlNsCache *)(ppxVar9 + -1))->oldNs == p_Var6->ns) {
              p_Var6->ns = *ppxVar9;
              uVar5 = uVar4;
              break;
            }
            uVar4 = uVar4 + 1;
            ppxVar9 = ppxVar9 + 2;
          } while (uVar5 != uVar4);
        }
        if ((uint)uVar5 == uVar8) {
          pxVar2 = xmlNewReconciledNs(tree,p_Var6->ns);
          if ((pxVar2 == (xmlNsPtr)0x0) ||
             ((local_3c <= (int)uVar8 && (iVar1 = xmlGrowNsCache(&local_38,&local_3c), iVar1 < 0))))
          {
            iVar7 = -1;
          }
          else {
            local_38[(int)uVar8].newNs = pxVar2;
            local_38[(int)uVar8].oldNs = p_Var6->ns;
            uVar8 = uVar8 + 1;
          }
          p_Var6->ns = pxVar2;
        }
      }
      if (p_Var6->type == XML_ELEMENT_NODE) {
        for (p_Var10 = p_Var6->properties; p_Var10 != (_xmlAttr *)0x0; p_Var10 = p_Var10->next) {
          if (p_Var10->ns != (xmlNs *)0x0) {
            if ((int)uVar8 < 1) {
              uVar5 = 0;
            }
            else {
              uVar5 = (ulong)uVar8;
              ppxVar9 = &local_38->newNs;
              uVar4 = 0;
              do {
                if (((xmlNsCache *)(ppxVar9 + -1))->oldNs == p_Var10->ns) {
                  p_Var10->ns = *ppxVar9;
                  uVar5 = uVar4;
                  break;
                }
                uVar4 = uVar4 + 1;
                ppxVar9 = ppxVar9 + 2;
              } while (uVar5 != uVar4);
            }
            if ((uint)uVar5 == uVar8) {
              pxVar2 = xmlNewReconciledNs(tree,p_Var10->ns);
              if ((pxVar2 == (xmlNsPtr)0x0) ||
                 ((local_3c <= (int)uVar8 &&
                  (iVar1 = xmlGrowNsCache(&local_38,&local_3c), iVar1 < 0)))) {
                iVar7 = -1;
              }
              else {
                local_38[(int)uVar8].newNs = pxVar2;
                local_38[(int)uVar8].oldNs = p_Var10->ns;
                uVar8 = uVar8 + 1;
              }
              p_Var10->ns = pxVar2;
            }
          }
        }
      }
      if ((p_Var6->children == (_xmlNode *)0x0) ||
         (p_Var3 = p_Var6->children, p_Var6->type == XML_ENTITY_REF_NODE)) {
        if (p_Var6 == tree) break;
        p_Var3 = p_Var6->next;
        if (p_Var6->next == (_xmlNode *)0x0) {
          do {
            if (p_Var6 == tree) goto LAB_00150c8a;
            pxVar11 = p_Var6;
            if (p_Var6->parent != (xmlNodePtr)0x0) {
              pxVar11 = p_Var6->parent;
            }
            if ((pxVar11 != tree) && (p_Var6 = pxVar11->next, p_Var6 != (_xmlNode *)0x0))
            goto LAB_00150c8a;
            p_Var6 = pxVar11;
          } while (pxVar11->parent != (_xmlNode *)0x0);
          p_Var6 = (_xmlNode *)0x0;
LAB_00150c8a:
          p_Var3 = (_xmlNode *)0x0;
          if (p_Var6 != tree) {
            p_Var3 = p_Var6;
          }
        }
      }
      p_Var6 = p_Var3;
    } while (p_Var3 != (_xmlNode *)0x0);
    if (local_38 != (xmlNsCache *)0x0) {
      (*xmlFree)(local_38);
    }
  }
  return iVar7;
}

Assistant:

int
xmlReconciliateNs(xmlDocPtr doc, xmlNodePtr tree) {
    xmlNsCache *cache = NULL;
    int sizeCache = 0;
    int nbCache = 0;

    xmlNsPtr n;
    xmlNodePtr node = tree;
    xmlAttrPtr attr;
    int ret = 0, i;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) return(-1);
    if (node->doc != doc) return(-1);
    while (node != NULL) {
        /*
	 * Reconciliate the node namespace
	 */
	if (node->ns != NULL) {
	    for (i = 0; i < nbCache; i++) {
	        if (cache[i].oldNs == node->ns) {
		    node->ns = cache[i].newNs;
		    break;
		}
	    }
	    if (i == nbCache) {
	        /*
		 * OK we need to recreate a new namespace definition
		 */
		n = xmlNewReconciledNs(tree, node->ns);
		if (n == NULL) {
                    ret = -1;
                } else {
		    /*
		     * check if we need to grow the cache buffers.
		     */
		    if ((sizeCache <= nbCache) &&
                        (xmlGrowNsCache(&cache, &sizeCache) < 0)) {
                        ret = -1;
		    } else {
                        cache[nbCache].newNs = n;
                        cache[nbCache++].oldNs = node->ns;
                    }
                }
		node->ns = n;
	    }
	}
	/*
	 * now check for namespace held by attributes on the node.
	 */
	if (node->type == XML_ELEMENT_NODE) {
	    attr = node->properties;
	    while (attr != NULL) {
		if (attr->ns != NULL) {
		    for (i = 0; i < nbCache; i++) {
			if (cache[i].oldNs == attr->ns) {
			    attr->ns = cache[i].newNs;
			    break;
			}
		    }
		    if (i == nbCache) {
			/*
			 * OK we need to recreate a new namespace definition
			 */
			n = xmlNewReconciledNs(tree, attr->ns);
			if (n == NULL) {
                            ret = -1;
                        } else {
			    /*
			     * check if we need to grow the cache buffers.
			     */
                            if ((sizeCache <= nbCache) &&
                                (xmlGrowNsCache(&cache, &sizeCache) < 0)) {
                                ret = -1;
                            } else {
                                cache[nbCache].newNs = n;
                                cache[nbCache++].oldNs = attr->ns;
			    }
			}
			attr->ns = n;
		    }
		}
		attr = attr->next;
	    }
	}

	/*
	 * Browse the full subtree, deep first
	 */
        if ((node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
	    /* deep first */
	    node = node->children;
	} else if ((node != tree) && (node->next != NULL)) {
	    /* then siblings */
	    node = node->next;
	} else if (node != tree) {
	    /* go up to parents->next if needed */
	    while (node != tree) {
	        if (node->parent != NULL)
		    node = node->parent;
		if ((node != tree) && (node->next != NULL)) {
		    node = node->next;
		    break;
		}
		if (node->parent == NULL) {
		    node = NULL;
		    break;
		}
	    }
	    /* exit condition */
	    if (node == tree)
	        node = NULL;
	} else
	    break;
    }
    if (cache != NULL)
	xmlFree(cache);
    return(ret);
}